

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

optional<std::shared_ptr<ExpressionAstNode>_> * __thiscall
Parser::parseExpression
          (optional<std::shared_ptr<ExpressionAstNode>_> *__return_storage_ptr__,Parser *this)

{
  uint uVar1;
  _Storage<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>,_false> local_38;
  char local_28;
  
  skipWhiteSpace(this);
  (__return_storage_ptr__->super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>).
  _M_payload.super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged = false;
  TokenBuffer::currentToken((TokenBuffer *)&local_38._M_value);
  uVar1 = *(uint *)&((local_38._M_value.
                      super___shared_ptr<BuiltInFunctionInvocationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->expressions).
                    super__Vector_base<std::shared_ptr<ExpressionAstNode>,_std::allocator<std::shared_ptr<ExpressionAstNode>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
  if (local_38._M_value.
      super___shared_ptr<BuiltInFunctionInvocationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_38._M_value.
               super___shared_ptr<BuiltInFunctionInvocationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (uVar1 < 0x1d) {
    if ((0xe300000U >> (uVar1 & 0x1f) & 1) != 0) {
      parseLiteralExpression
                ((optional<std::shared_ptr<LiteralExpressionAstNode>_> *)&local_38._M_value,this);
      std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
                ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
                 (optional<std::shared_ptr<LiteralExpressionAstNode>_> *)&local_38._M_value);
      goto LAB_0010b342;
    }
    if (uVar1 == 9) {
      parseFunctionDeclarationExpression
                ((optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
                 &local_38._M_value,this);
      std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
                ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
                 (optional<std::shared_ptr<FunctionDeclarationExpressionAstNode>_> *)
                 &local_38._M_value);
      goto LAB_0010b342;
    }
    if (uVar1 == 0x1c) {
      parseFunctionInvocationLike<BuiltInFunctionInvocationExpressionAstNode>
                ((optional<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_> *)
                 &local_38._M_value,this,BuiltInFunctionName);
      std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
                ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
                 (optional<std::shared_ptr<BuiltInFunctionInvocationExpressionAstNode>_> *)
                 &local_38._M_value);
      goto LAB_0010b342;
    }
  }
  if (uVar1 == 2) {
    parseObjectDeclarationExpression
              ((optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *)&local_38._M_value,
               this);
    std::optional<std::shared_ptr<ExpressionAstNode>>::operator=
              ((optional<std::shared_ptr<ExpressionAstNode>> *)__return_storage_ptr__,
               (optional<std::shared_ptr<ObjectDeclarationExpressionAstNode>_> *)&local_38._M_value)
    ;
  }
  else {
    parseIdentifierOrFunctionInvocationExpression
              ((optional<std::shared_ptr<ExpressionAstNode>_> *)&local_38._M_value,this);
    std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_copy_assign
              ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)__return_storage_ptr__
               ,(_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)&local_38._M_value);
  }
LAB_0010b342:
  if (local_28 == '\x01') {
    local_28 = '\0';
    if (local_38._M_value.
        super___shared_ptr<BuiltInFunctionInvocationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 local_38._M_value.
                 super___shared_ptr<BuiltInFunctionInvocationExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  skipWhiteSpace(this);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<ExpressionAstNode>>
Parser::parseExpression() noexcept {
  this->skipWhiteSpace();

  std::optional<std::shared_ptr<ExpressionAstNode>> e;

  switch (this->tokenBuffer->currentToken()->tokenType)  {
    case TokenType::LeftCurly:
      e = this->parseObjectDeclarationExpression();
      this->skipWhiteSpace();
      return e;
    case TokenType::Function:
      e = this->parseFunctionDeclarationExpression();
      this->skipWhiteSpace();
      return e;
    case TokenType::BooleanLiteral:
    case TokenType::StringLiteral:
    case TokenType::IntegerLiteral:
    case TokenType::FloatLiteral:
    case TokenType::UndefinedLiteral:
      e = this->parseLiteralExpression();
      this->skipWhiteSpace();
      return e;
    case TokenType::BuiltInFunctionName:
      e = this->parseBuiltInFunctionInvocationExpression();
      this->skipWhiteSpace();
      return e;
    default:
      e = this->parseIdentifierOrFunctionInvocationExpression();
      this->skipWhiteSpace();
      return e;
  }
}